

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O1

void __thiscall
rsg::BinaryOp<8,_(rsg::Associativity)0>::tokenize
          (BinaryOp<8,_(rsg::Associativity)0> *this,GeneratorState *state,TokenStream *str)

{
  Token local_28;
  
  (*this->m_leftValueExpr->_vptr_Expression[3])();
  local_28.m_type = this->m_operator;
  if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
              (&str->m_tokens,str->m_numTokens + 0x40);
  }
  Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_28);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_28);
  (*this->m_rightValueExpr->_vptr_Expression[3])(this->m_rightValueExpr,state,str);
  return;
}

Assistant:

void BinaryOp<Precedence, Assoc>::tokenize (GeneratorState& state, TokenStream& str) const
{
	m_leftValueExpr->tokenize(state, str);
	str << m_operator;
	m_rightValueExpr->tokenize(state, str);
}